

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::TraceUpdateConstructorCache
               (ConstructorCache *ctorCache,FunctionBody *ctorBody,bool updated,char16 *reason)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  char16 *pcVar5;
  char16_t *pcVar6;
  char16_t *pcVar7;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)ctorBody);
  if ((ctorBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,ConstructorCachePhase,sourceContextId,
                            ((ctorBody->super_ParseableFunctionInfo).super_FunctionProxy.
                             functionInfo.ptr)->functionId);
  if (bVar2) {
    iVar3 = (*(ctorBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(ctorBody);
    pcVar7 = L"did not update";
    pcVar5 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)ctorBody,(wchar (*) [42])local_98);
    if (updated) {
      pcVar7 = L"updated";
    }
    pcVar6 = L", because";
    if (updated) {
      pcVar6 = L"";
    }
    Output::Print(L"CtorCache: %s cache (0x%p) for ctor %s (%s)%s %s: ",pcVar7,ctorBody,
                  CONCAT44(extraout_var,iVar3),pcVar5,pcVar6,reason);
    ConstructorCache::Dump(ctorCache);
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptOperators::TraceUpdateConstructorCache(const ConstructorCache* ctorCache, const FunctionBody* ctorBody, bool updated, const char16* reason)
    {
#if DBG_DUMP
        if (PHASE_TRACE(Js::ConstructorCachePhase, ctorBody))
        {
            const char16* ctorName = ctorBody->GetDisplayName();
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("CtorCache: %s cache (0x%p) for ctor %s (%s)%s %s: "),
                updated ? _u("updated") : _u("did not update"), ctorBody, ctorName,
                ctorBody ? const_cast<Js::FunctionBody *>(ctorBody)->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                updated ? _u("") : _u(", because") , reason);
            ctorCache->Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }